

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::jr::jr(jr *this,shared_ptr<vmips::VirtReg> *reg)

{
  shared_ptr<vmips::VirtReg> local_28;
  shared_ptr<vmips::VirtReg> *local_18;
  shared_ptr<vmips::VirtReg> *reg_local;
  jr *this_local;
  
  local_18 = reg;
  reg_local = (shared_ptr<vmips::VirtReg> *)this;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&local_28,reg);
  Unary::Unary(&this->super_Unary,&local_28);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_28);
  (this->super_Unary).super_Instruction._vptr_Instruction =
       (_func_int **)&PTR_collect_register_001c10b8;
  return;
}

Assistant:

jr::jr(std::shared_ptr<VirtReg> reg) : Unary(std::move(reg)) {}